

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
findNode<std::pair<QObject*,QByteArray>>
          (Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>> *this,
          pair<QObject_*,_QByteArray> *key)

{
  byte bVar1;
  QHashMultiReturnType<QObject_*,_QByteArray> hash;
  Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *pNVar2;
  Bucket BVar3;
  
  hash = qHashMulti<QObject*,QByteArray>(*(size_t *)(this + 0x18),&key->first,&key->second);
  BVar3 = findBucketWithHash<std::pair<QObject*,QByteArray>>(this,key,hash);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)0x0;
  }
  else {
    pNVar2 = (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)
             (((BVar3.span)->entries->storage).data + (uint)bVar1 * 0x28);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }